

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_BinaryExpr_Test::TestBody(ExprTest_BinaryExpr_Test *this)

{
  NumericExpr lhs_00;
  NumericExpr lhs_01;
  NumericExpr lhs_02;
  NumericExpr lhs_03;
  bool bVar1;
  AssertHelper *this_00;
  AssertionFailure *e_3;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_5;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_4;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  Reference rhs;
  NumericConstant lhs;
  AssertionResult gtest_ar_;
  BinaryExpr e;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  AssertionResult *in_stack_fffffffffffffb80;
  Kind kind;
  ExprTest *in_stack_fffffffffffffb88;
  ExprBase in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  Type in_stack_fffffffffffffbac;
  AssertionResult *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  char *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  AssertionResult *in_stack_fffffffffffffbf8;
  AssertHelper *in_stack_fffffffffffffc00;
  allocator<char> local_291;
  string local_290 [32];
  AssertionResult local_270 [3];
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_240;
  Impl *local_238;
  byte local_21a;
  allocator<char> local_219;
  string local_218 [32];
  AssertionResult local_1f8 [3];
  int local_1c4;
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_1c0;
  Impl *local_1b8;
  Impl *local_1a8;
  byte local_192;
  allocator<char> local_191;
  string local_190 [32];
  AssertionResult local_170 [2];
  ExprBase local_150;
  AssertionResult local_148 [2];
  ExprBase local_128;
  AssertionResult local_120 [2];
  Kind local_100;
  undefined4 local_fc;
  AssertionResult local_f8;
  string local_e8 [48];
  AssertionResult local_b8;
  ExprBase local_a8;
  ExprBase local_98;
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_88;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_80;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  ::BasicBinaryExpr((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                     *)0x11c6b4);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffb80,(bool)in_stack_fffffffffffffb7f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               in_stack_fffffffffffffbe0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x11c7d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c850);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )in_stack_fffffffffffffb90.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffb88,
                  (double)in_stack_fffffffffffffb80);
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),0);
  local_98.impl_ = (Impl *)local_78.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
             (NumericConstant)in_stack_fffffffffffffb90.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  local_a8.impl_ = (Impl *)local_80.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
             (Reference)in_stack_fffffffffffffb90.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb9c;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb98;
  local_88.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeBinary
                 (in_stack_fffffffffffffb88,(Kind)((ulong)in_stack_fffffffffffffb80 >> 0x20),lhs_00,
                  (NumericExpr)in_stack_fffffffffffffb90.impl_);
  local_10[0].impl_ = (Impl *)local_88.super_ExprBase.impl_;
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffb80,(bool)in_stack_fffffffffffffb7f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               in_stack_fffffffffffffbe0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x11ca7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11caf7);
  local_fc = 0x1c;
  local_100 = mp::internal::ExprBase::kind((ExprBase *)0x11cb0f);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (char *)in_stack_fffffffffffffb90.impl_,(Kind *)in_stack_fffffffffffffb88,
             (Kind *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11cbb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x11cc1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cc70);
  local_128.impl_ =
       (Impl *)mp::
               BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
               ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                      *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
  testing::internal::EqHelper<false>::
  Compare<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (char *)in_stack_fffffffffffffb90.impl_,(NumericConstant *)in_stack_fffffffffffffb88,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11cd27);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x11cd8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cddf);
  local_150.impl_ =
       (Impl *)mp::
               BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
               ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                      *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
  testing::internal::EqHelper<false>::
  Compare<mp::Reference,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (char *)in_stack_fffffffffffffb90.impl_,(Reference *)in_stack_fffffffffffffb88,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11ce96);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x11cef9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11cf51);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbb8,(allocator<char> *)in_stack_fffffffffffffbb0);
    std::allocator<char>::~allocator(&local_191);
    local_192 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1a8 = (Impl *)local_78.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
                 (NumericConstant)in_stack_fffffffffffffb90.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
      local_1b8 = (Impl *)local_80.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
                 (Reference)in_stack_fffffffffffffb90.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
      lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb9c;
      lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb98;
      local_1c0.super_ExprBase.impl_ =
           (ExprBase)
           ExprTest::MakeBinary
                     (in_stack_fffffffffffffb88,(Kind)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                      lhs_01,(NumericExpr)in_stack_fffffffffffffb90.impl_);
    }
    if ((local_192 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbb0,
                 (char (*) [116])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_1c4 = 2;
    }
    else {
      local_1c4 = 0;
    }
    std::__cxx11::string::~string(local_190);
    if (local_1c4 != 0) goto LAB_0011d34f;
  }
  else {
LAB_0011d34f:
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11d36b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x11d3ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d426);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbb8,(allocator<char> *)in_stack_fffffffffffffbb0);
    std::allocator<char>::~allocator(&local_219);
    local_21a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x11d4d4);
      local_238 = (Impl *)local_80.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
                 (Reference)in_stack_fffffffffffffb90.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb80 >> 0x20));
      lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb9c;
      lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb98;
      local_240.super_ExprBase.impl_ =
           (ExprBase)
           ExprTest::MakeBinary
                     (in_stack_fffffffffffffb88,(Kind)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                      lhs_02,(NumericExpr)in_stack_fffffffffffffb90.impl_);
    }
    if ((local_21a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffbb0,
                 (char (*) [127])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      local_1c4 = 3;
    }
    else {
      local_1c4 = 0;
    }
    std::__cxx11::string::~string(local_218);
    if (local_1c4 != 0) goto LAB_0011d7fe;
  }
  else {
LAB_0011d7fe:
    testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11d81a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb80);
    testing::Message::~Message((Message *)0x11d877);
  }
  kind = (Kind)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11d8cf);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbb8,(allocator<char> *)in_stack_fffffffffffffbb0);
    std::allocator<char>::~allocator(&local_291);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffb88,
                 (NumericConstant)in_stack_fffffffffffffb90.impl_,kind);
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x11d98e);
      lhs_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb9c;
      lhs_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb98;
      ExprTest::MakeBinary
                (in_stack_fffffffffffffb88,kind,lhs_03,(NumericExpr)in_stack_fffffffffffffb90.impl_)
      ;
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffbb0,
               (char (*) [127])CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    local_1c4 = 4;
    std::__cxx11::string::~string(local_290);
    if (local_1c4 == 0) goto LAB_0011dd32;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffbb0);
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11dc8d);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
             in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             (char *)in_stack_fffffffffffffb90.impl_);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x11dcea);
LAB_0011dd32:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11dd3f);
  return;
}

Assistant:

TEST_F(ExprTest, BinaryExpr) {
  mp::BinaryExpr e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  auto lhs = factory_.MakeNumericConstant(42);
  auto rhs = factory_.MakeVariable(0);
  e = MakeBinary(expr::MUL, lhs, rhs);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::MUL, e.kind());
  EXPECT_EQ(lhs, e.lhs());
  EXPECT_EQ(rhs, e.rhs());
  EXPECT_ASSERT(MakeBinary(expr::IF, lhs, rhs), "invalid expression kind");
  EXPECT_ASSERT(MakeBinary(expr::MUL, NumericExpr(), rhs), "invalid argument");
  EXPECT_ASSERT(MakeBinary(expr::MUL, lhs, NumericExpr()), "invalid argument");
}